

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateSerializeOneofFields
          (MessageGenerator *this,Printer *printer,
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          *fields,bool to_array)

{
  FieldDescriptor *field;
  LogMessage *other;
  pointer ppFVar1;
  FieldGenerator *pFVar2;
  pointer ppFVar3;
  ulong uVar4;
  LogFinisher local_71;
  MessageGenerator *local_70;
  LogMessage local_68;
  
  ppFVar1 = (fields->
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  ppFVar3 = (fields->
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  local_70 = this;
  if (ppFVar1 == ppFVar3) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
               ,0xde0);
    other = internal::LogMessage::operator<<(&local_68,"CHECK failed: !fields.empty(): ");
    internal::LogFinisher::operator=(&local_71,other);
    internal::LogMessage::~LogMessage(&local_68);
    ppFVar1 = (fields->
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    ppFVar3 = (fields->
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              )._M_impl.super__Vector_impl_data._M_finish;
  }
  if ((long)ppFVar3 - (long)ppFVar1 == 8) {
    GenerateSerializeOneField(local_70,printer,*ppFVar1,to_array,-1);
  }
  else {
    io::Printer::Print(printer,"switch ($oneofname$_case()) {\n","oneofname",
                       (string *)**(undefined8 **)(*ppFVar1 + 0x60));
    io::Printer::Indent(printer);
    local_70 = (MessageGenerator *)&local_70->field_generators_;
    for (uVar4 = 0;
        ppFVar1 = (fields->
                  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  )._M_impl.super__Vector_impl_data._M_start,
        uVar4 < (ulong)((long)(fields->
                              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar1 >> 3);
        uVar4 = uVar4 + 1) {
      field = ppFVar1[uVar4];
      UnderscoresToCamelCase((string *)&local_68,*(string **)field,true);
      io::Printer::Print(printer,"case k$field_name$:\n","field_name",(string *)&local_68);
      std::__cxx11::string::~string((string *)&local_68);
      io::Printer::Indent(printer);
      pFVar2 = FieldGeneratorMap::get((FieldGeneratorMap *)local_70,field);
      (*pFVar2->_vptr_FieldGenerator[(ulong)to_array + 0x15])(pFVar2,printer);
      io::Printer::Print(printer,"break;\n");
      io::Printer::Outdent(printer);
    }
    io::Printer::Outdent(printer);
    io::Printer::Print(printer,"  default: ;\n}\n");
  }
  return;
}

Assistant:

void MessageGenerator::GenerateSerializeOneofFields(
    io::Printer* printer, const std::vector<const FieldDescriptor*>& fields,
    bool to_array) {
  GOOGLE_CHECK(!fields.empty());
  if (fields.size() == 1) {
    GenerateSerializeOneField(printer, fields[0], to_array, -1);
    return;
  }
  // We have multiple mutually exclusive choices.  Emit a switch statement.
  const OneofDescriptor* oneof = fields[0]->containing_oneof();
  printer->Print(
    "switch ($oneofname$_case()) {\n",
    "oneofname", oneof->name());
  printer->Indent();
  for (int i = 0; i < fields.size(); i++) {
    const FieldDescriptor* field = fields[i];
    printer->Print(
      "case k$field_name$:\n",
      "field_name", UnderscoresToCamelCase(field->name(), true));
    printer->Indent();
    if (to_array) {
      field_generators_.get(field).GenerateSerializeWithCachedSizesToArray(
          printer);
    } else {
      field_generators_.get(field).GenerateSerializeWithCachedSizes(printer);
    }
    printer->Print(
      "break;\n");
    printer->Outdent();
  }
  printer->Outdent();
  // Doing nothing is an option.
  printer->Print(
    "  default: ;\n"
    "}\n");
}